

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# keyevent.c
# Opt level: O2

void process_io_events(void)

{
  int iVar1;
  LispPTR *pLVar2;
  long lVar3;
  ulong uVar4;
  uint uVar5;
  __fd_mask *p_Var6;
  uint uVar7;
  __fd_mask *p_Var8;
  fd_set rfds;
  
  lVar3 = 0x10;
  p_Var6 = LispReadFds.__fds_bits;
  p_Var8 = rfds.__fds_bits;
  for (; lVar3 != 0; lVar3 = lVar3 + -1) {
    *p_Var8 = *p_Var6;
    p_Var6 = p_Var6 + 1;
    p_Var8 = p_Var8 + 1;
  }
  iVar1 = select(0x20,(fd_set *)&rfds,(fd_set *)0x0,(fd_set *)0x0,(timeval *)&SelectTimeout);
  if (0 < iVar1) {
    uVar5 = 0;
    for (uVar4 = 0; uVar4 != 0x20; uVar4 = uVar4 + 1) {
      uVar7 = 1 << ((byte)uVar4 & 0x1f);
      if (((ulong)LispIOFds.__fds_bits[0] >> (uVar4 & 0x3f) & 1) == 0) {
        uVar7 = 0;
      }
      if (((ulong)rfds.__fds_bits[0] >> (uVar4 & 0x3f) & 1) == 0) {
        uVar7 = 0;
      }
      uVar5 = uVar5 | uVar7;
    }
    if (uVar5 != 0) {
      pLVar2 = NativeAligned4FromLAddr(*IOINTERRUPTFLAGS_word);
      *pLVar2 = uVar5;
      pLVar2 = NativeAligned4FromLAddr(*INTERRUPTSTATE_word);
      *(byte *)((long)pLVar2 + 3) = *(byte *)((long)pLVar2 + 3) | 0x20;
      *PENDINGINTERRUPT68k = 0x4c;
      MachineState.irqcheck = 0;
      MachineState.irqend = 0;
    }
  }
  return;
}

Assistant:

void process_io_events(void)
{
#ifndef DOS
  fd_set rfds;
  u_int iflags;
  int i;

  memcpy(&rfds, &LispReadFds, sizeof(rfds));

  if (select(32, &rfds, NULL, NULL, &SelectTimeout) > 0) {

#ifdef MAIKO_ENABLE_ETHERNET
    if (ether_fd >= 0 && FD_ISSET(ether_fd, &rfds)) { /* Raw ethernet (NIT) I/O happened, so handle it. */
      DBPRINT(("Handling enet interrupt.\n\n"));
      check_ether();
    }
#endif /* MAIKO_ENABLE_ETHERNET */

#ifdef MAIKO_ENABLE_NETHUB
    check_ether();
#endif /* MAIKO_ENABLE_NETHUB */

#ifdef RS232
    if (RS232C_Fd >= 0 && (FD_ISSET(RS232C_Fd, &rfds) || (RS232C_remain_data && rs232c_lisp_is_ready())))
      rs232c_read();
#endif /* RS232 */

#if defined(MAIKO_HANDLE_CONSOLE_MESSAGES) && defined(LOGINT)
    if (LogFileFd >= 0 && FD_ISSET(LogFileFd, &rfds)) { /* There's info in the log file.  Tell Lisp to print it. */
      flush_pty();          /* move the msg(s) to the log file */

      ((INTSTAT *)NativeAligned4FromLAddr(*INTERRUPTSTATE_word))->LogFileIO = 1;

      *PENDINGINTERRUPT68k = ATOM_T;
      Irq_Stk_End = Irq_Stk_Check = 0;
    }
#endif
    iflags = 0;
    for (i = 0; i < 32; i++)
        if (FD_ISSET(i, &rfds) & FD_ISSET(i, &LispIOFds)) iflags |= 1 << i;
    if (iflags) { /* There's activity on a Lisp-opened FD.  Tell Lisp. */
      u_int *flags;
      flags = (u_int *)NativeAligned4FromLAddr(*IOINTERRUPTFLAGS_word);
      *flags = iflags;

      ((INTSTAT *)NativeAligned4FromLAddr(*INTERRUPTSTATE_word))->IOInterrupt = 1;

      *PENDINGINTERRUPT68k = ATOM_T;
      Irq_Stk_End = Irq_Stk_Check = 0;
    }
  }
/* #endif */
#endif /* DOS */
}